

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O2

void __thiscall
burst::
intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
::settle(intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
         *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  iterator iVar4;
  type_conflict3 tVar5;
  reference piVar6;
  reference piVar7;
  outer_range_iterator range;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  max_range;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_78;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_60;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_48;
  
  tVar5 = boost::iterators::operator!=
                    ((iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                      *)this,(iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                              *)&this->m_end);
  if (tVar5) {
    owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
    ::owning_iterator(&local_48,&this->m_end);
    std::
    prev<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>,std::allocator<boost::iterator_range<std::_List_const_iterator<int>>>>>>
              (&max_range,&local_48,1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.m_container.
                super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
    ::owning_iterator(&range,&this->m_begin);
    while( true ) {
      tVar5 = boost::iterators::operator!=
                        ((iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                          *)&range,
                         (iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                          *)&max_range);
      if (!tVar5) break;
      piVar6 = boost::iterator_range_detail::
               iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               ::front((iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                        *)range.m_iterator._M_current);
      piVar7 = boost::iterator_range_detail::
               iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               ::front((iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                        *)max_range.m_iterator._M_current);
      iVar4 = range.m_iterator;
      if (*piVar7 < *piVar6) {
        piVar6 = boost::iterator_range_detail::
                 iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                 ::front((iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                          *)max_range.m_iterator._M_current);
        skip_to_lower_bound<boost::iterator_range<std::_List_const_iterator<int>>,int,std::greater<void>>
                  (iVar4._M_current,piVar6);
        if (((range.m_iterator._M_current)->
            super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
            ).
            super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
            .m_Begin._M_node ==
            ((range.m_iterator._M_current)->
            super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
            ).
            super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
            .m_End._M_node) {
          scroll_to_end(this);
          break;
        }
      }
      piVar6 = boost::iterator_range_detail::
               iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               ::front((iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                        *)max_range.m_iterator._M_current);
      piVar7 = boost::iterator_range_detail::
               iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               ::front((iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                        *)range.m_iterator._M_current);
      if (*piVar7 < *piVar6) {
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::owning_iterator(&local_60,&max_range);
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::owning_iterator(&local_78,&range);
        p_Var1 = ((local_60.m_iterator._M_current)->
                 super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                 ).
                 super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin._M_node;
        p_Var2 = ((local_60.m_iterator._M_current)->
                 super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                 ).
                 super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                 .m_End._M_node;
        p_Var3 = ((local_78.m_iterator._M_current)->
                 super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                 ).
                 super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                 .m_End._M_node;
        ((local_60.m_iterator._M_current)->
        super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
        ).
        super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_node =
             ((local_78.m_iterator._M_current)->
             super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
             ).
             super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin._M_node;
        ((local_60.m_iterator._M_current)->
        super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
        ).
        super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        .m_End._M_node = p_Var3;
        ((local_78.m_iterator._M_current)->
        super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
        ).
        super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_node = p_Var1;
        ((local_78.m_iterator._M_current)->
        super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
        ).
        super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        .m_End._M_node = p_Var2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_78.m_container.
                    super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_60.m_container.
                    super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::operator=(&range,&this->m_begin);
      }
      else {
        range.m_iterator._M_current = range.m_iterator._M_current + 1;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&range.m_container.
                super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&max_range.m_container.
                super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

void settle ()
        {
            if (m_begin != m_end)
            {
                const auto max_range = std::prev(m_end);

                auto range = m_begin;
                while (range != max_range)
                {
                    if (m_compare(range->front(), max_range->front()))
                    {
                        skip_to_lower_bound(*range, max_range->front(), m_compare);
                        if (range->empty())
                        {
                            scroll_to_end();
                            return;
                        }
                    }

                    if (m_compare(max_range->front(), range->front()))
                    {
                        // Возможно, тут надо продвинуть последний диапазон до нового минимума и
                        // посмотреть, нужно ли его после этого менять местами с текущим
                        // диапазоном. Возможно, это будет цикл.
                        std::iter_swap(max_range, range);
                        range = m_begin;
                    }
                    else
                    {
                        ++range;
                    }
                }
            }
        }